

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixUtils.cpp
# Opt level: O1

set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_> *
findRationalSolutions
          (set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_>
           *__return_storage_ptr__,Polynomial *polynomial)

{
  _Rb_tree_header *p_Var1;
  RationalNum *pRVar2;
  size_t numerator_;
  bool bVar3;
  int iVar4;
  int iVar5;
  _Base_ptr p_Var6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  RationalNum x_00;
  set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_> *rationalSolutions;
  RationalNum x;
  set<long_long,_std::less<long_long>,_std::allocator<long_long>_> pValues;
  set<long_long,_std::less<long_long>,_std::allocator<long_long>_> qValues;
  RationalNum local_d8;
  _Rb_tree_node_base *local_c8;
  RationalNum local_c0;
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  local_b0;
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  local_80;
  RationalNum local_50;
  RationalNum local_40;
  
  lVar9 = 1;
  uVar7 = 0xffffffffffffffff;
  lVar8 = 0;
  do {
    iVar4 = RationalNum::getDenominator
                      ((RationalNum *)((long)&polynomial->coefficients->numerator + lVar8));
    lVar9 = lVar9 * iVar4;
    uVar7 = uVar7 + 1;
    lVar8 = lVar8 + 0x10;
  } while (uVar7 < polynomial->degree);
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar8 = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar7 = 0xffffffffffffffff;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    pRVar2 = polynomial->coefficients;
    RationalNum::RationalNum((RationalNum *)&local_80,0,1);
    bVar3 = operator!=((RationalNum *)((long)&pRVar2->numerator + lVar8),(RationalNum *)&local_80);
    if (bVar3) {
      iVar4 = RationalNum::getNumerator
                        ((RationalNum *)((long)&polynomial->coefficients->numerator + lVar8));
      iVar5 = RationalNum::getDenominator(polynomial->coefficients);
      getDivisors((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)&local_80,
                  (long)iVar4 * (lVar9 / (long)iVar5));
      std::
      _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
      ::clear(&local_b0);
      if (local_80._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var1 = &local_80._M_impl.super__Rb_tree_header;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_color =
             local_80._M_impl.super__Rb_tree_header._M_header._M_color;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
             local_80._M_impl.super__Rb_tree_header._M_header._M_left;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_80._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_80._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &local_b0._M_impl.super__Rb_tree_header._M_header;
        local_b0._M_impl.super__Rb_tree_header._M_node_count =
             local_80._M_impl.super__Rb_tree_header._M_node_count;
        local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_80._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_80._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      }
      std::
      _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
      ::~_Rb_tree(&local_80);
      break;
    }
    lVar8 = lVar8 + 0x10;
    uVar7 = uVar7 + 1;
  } while (uVar7 < polynomial->degree);
  iVar4 = RationalNum::getNumerator(polynomial->coefficients + polynomial->degree);
  iVar5 = RationalNum::getDenominator(polynomial->coefficients + polynomial->degree);
  getDivisors((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)&local_80,
              (long)iVar4 * (lVar9 / (long)iVar5));
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8 = local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_b0._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_b0._M_impl.super__Rb_tree_header) {
    do {
      if ((_Rb_tree_header *)local_80._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_80._M_impl.super__Rb_tree_header) {
        numerator_ = *(size_t *)(local_c8 + 1);
        p_Var6 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          RationalNum::RationalNum(&local_c0,numerator_,*(longlong *)(p_Var6 + 1));
          local_d8 = getPolynomialValue(polynomial,local_c0);
          RationalNum::RationalNum(&local_40,0,1);
          bVar3 = operator==(&local_d8,&local_40);
          if (bVar3) {
            std::
            _Rb_tree<RationalNum,RationalNum,std::_Identity<RationalNum>,std::less<RationalNum>,std::allocator<RationalNum>>
            ::_M_insert_unique<RationalNum_const&>
                      ((_Rb_tree<RationalNum,RationalNum,std::_Identity<RationalNum>,std::less<RationalNum>,std::allocator<RationalNum>>
                        *)__return_storage_ptr__,&local_c0);
          }
          x_00 = RationalNum::operator-(&local_c0);
          local_d8 = getPolynomialValue(polynomial,x_00);
          RationalNum::RationalNum(&local_40,0,1);
          bVar3 = operator==(&local_d8,&local_40);
          if (bVar3) {
            local_d8 = RationalNum::operator-(&local_c0);
            std::
            _Rb_tree<RationalNum,_RationalNum,_std::_Identity<RationalNum>,_std::less<RationalNum>,_std::allocator<RationalNum>_>
            ::_M_insert_unique<RationalNum>(&__return_storage_ptr__->_M_t,&local_d8);
          }
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        } while ((_Rb_tree_header *)p_Var6 != &local_80._M_impl.super__Rb_tree_header);
      }
      local_c8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_c8);
    } while ((_Rb_tree_header *)local_c8 != &local_b0._M_impl.super__Rb_tree_header);
  }
  RationalNum::RationalNum(&local_50,0,1);
  local_c0 = getPolynomialValue(polynomial,local_50);
  RationalNum::RationalNum(&local_d8,0,1);
  bVar3 = operator==(&local_c0,&local_d8);
  if (bVar3) {
    RationalNum::RationalNum(&local_c0,0,1);
    std::
    _Rb_tree<RationalNum,_RationalNum,_std::_Identity<RationalNum>,_std::less<RationalNum>,_std::allocator<RationalNum>_>
    ::_M_insert_unique<RationalNum>(&__return_storage_ptr__->_M_t,&local_c0);
  }
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::~_Rb_tree(&local_80);
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::~_Rb_tree(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

set<RationalNum> findRationalSolutions(Polynomial* polynomial) {
    long long int commonDenominator = 1;
    for(int i = 0; i <= polynomial->degree; i++) commonDenominator *= polynomial->coefficients[i].getDenominator();

    set<long long int> pValues;
    for(int i = 0; i <= polynomial->degree; i++) {
        if(polynomial->coefficients[i] != 0ll) {
            pValues = getDivisors(polynomial->coefficients[i].getNumerator() * (commonDenominator / polynomial->coefficients[0].getDenominator()));
            break;
        }
    }
    set<long long int> qValues = getDivisors(polynomial->coefficients[polynomial->degree].getNumerator() * (commonDenominator / polynomial->coefficients[polynomial->degree].getDenominator()));

    set<RationalNum> rationalSolutions;
    for(auto p : pValues) {
        for(auto q : qValues) {
            RationalNum x(p, q);
            if(getPolynomialValue(polynomial, x) == 0ll) rationalSolutions.insert(x);
            if(getPolynomialValue(polynomial, -x) == 0ll) rationalSolutions.insert(-x);
        }
    }
    if(getPolynomialValue(polynomial, 0ll) == 0ll) rationalSolutions.insert(0ll);

    return rationalSolutions;
}